

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_dist.cpp
# Opt level: O0

Future<double> * __thiscall
Omega_h::Dist::iexch<double>
          (Future<double> *__return_storage_ptr__,Dist *this,Read<double> *data,Int width)

{
  element_type *this_00;
  additional_callback_type local_130;
  undefined1 local_110 [8];
  anon_class_16_2_f8b76eb3 callback;
  Read<int> local_f0;
  Read<double> local_e0;
  undefined1 local_c9;
  Read<int> local_c8;
  Read<double> local_b8;
  Read<double> local_a8;
  Read<int> local_98 [2];
  Read<double> local_78;
  Read<double> local_68;
  ScopedTimer local_55;
  Int local_54;
  ScopedTimer exch_timer;
  Read<double> *pRStack_50;
  Int width_local;
  Read<double> *data_local;
  Dist *this_local;
  Future<double> *future;
  
  local_54 = width;
  pRStack_50 = data;
  ScopedTimer::ScopedTimer(&local_55,"Dist::iexch",(char *)0x0);
  if (this->roots2items_[0].write_.shared_alloc_.direct_ptr != (void *)0x0) {
    Read<double>::Read(&local_78,data);
    Read<int>::Read(local_98,this->roots2items_);
    expand<double>((Omega_h *)&local_68,(Read<signed_char> *)&local_78,local_98,local_54);
    Read<double>::operator=(data,&local_68);
    Read<double>::~Read(&local_68);
    Read<int>::~Read(local_98);
    Read<double>::~Read(&local_78);
  }
  if (this->items2content_[0].write_.shared_alloc_.direct_ptr != (void *)0x0) {
    Read<double>::Read(&local_b8,data);
    Read<int>::Read(&local_c8,this->items2content_);
    permute<double>((Omega_h *)&local_a8,(Read<signed_char> *)&local_b8,&local_c8,local_54);
    Read<double>::operator=(data,&local_a8);
    Read<double>::~Read(&local_a8);
    Read<int>::~Read(&local_c8);
    Read<double>::~Read(&local_b8);
  }
  local_c9 = 0;
  this_00 = std::__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)this->comm_);
  Read<double>::Read(&local_e0,data);
  Read<int>::Read(&local_f0,this->msgs2content_);
  Read<int>::Read((Read<int> *)&callback.width,this->msgs2content_ + 1);
  Comm::ialltoallv<double>
            (__return_storage_ptr__,this_00,&local_e0,&local_f0,(Read<int> *)&callback.width,
             local_54);
  Read<int>::~Read((Read<int> *)&callback.width);
  Read<int>::~Read(&local_f0);
  Read<double>::~Read(&local_e0);
  callback.this._0_4_ = local_54;
  local_110 = (undefined1  [8])this;
  std::function<Omega_h::Read<double>(Omega_h::Read<double>)>::
  function<Omega_h::Dist::iexch<double>(Omega_h::Read<double>,int)const::_lambda(Omega_h::Read<double>)_1_&,void>
            ((function<Omega_h::Read<double>(Omega_h::Read<double>)> *)&local_130,
             (anon_class_16_2_f8b76eb3 *)local_110);
  Future<double>::add_callback(__return_storage_ptr__,&local_130);
  std::function<Omega_h::Read<double>_(Omega_h::Read<double>)>::~function(&local_130);
  local_c9 = 1;
  ScopedTimer::~ScopedTimer(&local_55);
  return __return_storage_ptr__;
}

Assistant:

Future<T> Dist::iexch(Read<T> data, Int width) const {
  ScopedTimer exch_timer("Dist::iexch");
  if (roots2items_[F].exists()) {
    data = expand(data, roots2items_[F], width);
  }
  if (items2content_[F].exists()) {
    data = permute(data, items2content_[F], width);
  }
  auto future = comm_[F]->ialltoallv(data, msgs2content_[F], msgs2content_[R], width);
  auto callback = [this,width](Read<T> buf) {
    if (this->items2content_[R].exists()) {
      buf = unmap(this->items2content_[R], buf, width);
    }
    return buf;
  };
  future.add_callback(callback);
  return future;
}